

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void shiftChar(void)

{
  Expansion *expansion;
  int iVar1;
  Expansion *exp;
  
  if ((lexerState->capturing & 1U) != 0) {
    if (lexerState->captureBuf != (char *)0x0) {
      if (lexerState->captureCapacity <= lexerState->captureSize + 1) {
        reallocCaptureBuf();
      }
      iVar1 = peek();
      lexerState->captureBuf[lexerState->captureSize] = (char)iVar1;
    }
    lexerState->captureSize = lexerState->captureSize + 1;
  }
  lexerState->macroArgScanDistance = lexerState->macroArgScanDistance - 1;
  while (lexerState->expansions != (Expansion *)0x0) {
    if (lexerState->expansions->size < lexerState->expansions->offset) {
      __assert_fail("lexerState->expansions->offset <= lexerState->expansions->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                    ,0x3a6,"shiftChar");
    }
    lexerState->expansions->offset = lexerState->expansions->offset + 1;
    if (lexerState->expansions->offset <= lexerState->expansions->size) {
      return;
    }
    expansion = lexerState->expansions;
    lexerState->expansions = lexerState->expansions->parent;
    freeExpansion(expansion);
  }
  lexerState->colNo = lexerState->colNo + 1;
  if ((lexerState->isMmapped & 1U) == 0) {
    if (0x29 < (lexerState->field_2).field_0.size) {
      __assert_fail("lexerState->index < LEXER_BUF_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                    ,0x3b7,"shiftChar");
    }
    (lexerState->field_2).field_0.size = (lexerState->field_2).field_0.size + 1;
    if ((lexerState->field_2).field_0.size == 0x2a) {
      (lexerState->field_2).field_0.size = 0;
    }
    if ((lexerState->field_2).field_1.nbChars == 0) {
      __assert_fail("lexerState->nbChars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                    ,0x3bb,"shiftChar");
    }
    (lexerState->field_2).field_1.nbChars = (lexerState->field_2).field_1.nbChars - 1;
  }
  else {
    (lexerState->field_2).field_0.offset = (lexerState->field_2).field_0.offset + 1;
  }
  return;
}

Assistant:

static void shiftChar(void)
{
	if (lexerState->capturing) {
		if (lexerState->captureBuf) {
			if (lexerState->captureSize + 1 >= lexerState->captureCapacity)
				reallocCaptureBuf();
			// TODO: improve this?
			lexerState->captureBuf[lexerState->captureSize] = peek();
		}
		lexerState->captureSize++;
	}

	lexerState->macroArgScanDistance--;

restart:
	if (lexerState->expansions) {
		// Advance within the current expansion
		assert(lexerState->expansions->offset <= lexerState->expansions->size);
		lexerState->expansions->offset++;
		if (lexerState->expansions->offset > lexerState->expansions->size) {
			// When advancing would go past an expansion's end, free it,
			// move up to its parent, and try again to advance
			struct Expansion *exp = lexerState->expansions;

			lexerState->expansions = lexerState->expansions->parent;
			freeExpansion(exp);
			goto restart;
		}
	} else {
		// Advance within the file contents
		lexerState->colNo++;
		if (lexerState->isMmapped) {
			lexerState->offset++;
		} else {
			assert(lexerState->index < LEXER_BUF_SIZE);
			lexerState->index++;
			if (lexerState->index == LEXER_BUF_SIZE)
				lexerState->index = 0; // Wrap around if necessary
			assert(lexerState->nbChars > 0);
			lexerState->nbChars--;
		}
	}
}